

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O0

int has_best_pred_mv_sad(MV_REFERENCE_FRAME *ref_frame,MACROBLOCK *x)

{
  bool bVar1;
  bool bVar2;
  bool local_1b;
  int has_best_future_pred_mv_sad;
  int has_best_past_pred_mv_sad;
  MACROBLOCK *x_local;
  MV_REFERENCE_FRAME *ref_frame_local;
  
  bVar1 = false;
  bVar2 = false;
  if ((x->best_pred_mv_sad[0] < 0x7fffffff) && (x->best_pred_mv_sad[1] < 0x7fffffff)) {
    bVar1 = true;
    if (x->pred_mv_sad[*ref_frame] != x->best_pred_mv_sad[0]) {
      bVar1 = x->pred_mv_sad[ref_frame[1]] == x->best_pred_mv_sad[0];
    }
    bVar2 = true;
    if (x->pred_mv_sad[*ref_frame] != x->best_pred_mv_sad[1]) {
      bVar2 = x->pred_mv_sad[ref_frame[1]] == x->best_pred_mv_sad[1];
    }
  }
  local_1b = false;
  if (bVar1) {
    local_1b = bVar2;
  }
  return (int)local_1b;
}

Assistant:

static inline int has_best_pred_mv_sad(const MV_REFERENCE_FRAME *ref_frame,
                                       const MACROBLOCK *const x) {
  int has_best_past_pred_mv_sad = 0;
  int has_best_future_pred_mv_sad = 0;
  if (x->best_pred_mv_sad[0] < INT_MAX && x->best_pred_mv_sad[1] < INT_MAX) {
    has_best_past_pred_mv_sad =
        (x->pred_mv_sad[ref_frame[0]] == x->best_pred_mv_sad[0]) ||
        (x->pred_mv_sad[ref_frame[1]] == x->best_pred_mv_sad[0]);
    has_best_future_pred_mv_sad =
        (x->pred_mv_sad[ref_frame[0]] == x->best_pred_mv_sad[1]) ||
        (x->pred_mv_sad[ref_frame[1]] == x->best_pred_mv_sad[1]);
  }
  return (has_best_past_pred_mv_sad && has_best_future_pred_mv_sad);
}